

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O0

void Abc_TruthNpnPerform(Abc_TtStore_t *p,int NpnType,int fVerbose)

{
  uint uVar1;
  abctime aVar2;
  permInfo *x;
  Abc_TtMan_t *p_00;
  abctime aVar3;
  char *pcVar4;
  uint local_605c;
  Abc_TtMan_t *pMan;
  permInfo *pi;
  char *pAlgoName;
  int nClasses;
  int i;
  abctime clk;
  char local_6028 [4];
  uint uCanonPhase;
  char pCanonPerm [16];
  word pAuxWord1 [1024];
  word pAuxWord [1024];
  uint pAux [2048];
  int fVerbose_local;
  int NpnType_local;
  Abc_TtStore_t *p_local;
  
  aVar2 = Abc_Clock();
  pAlgoName._0_4_ = 0xffffffff;
  pi = (permInfo *)0x0;
  if (NpnType == 0) {
    pi = (permInfo *)anon_var_dwarf_952ba;
  }
  else if (NpnType == 1) {
    pi = (permInfo *)anon_var_dwarf_952d0;
  }
  else if (NpnType == 2) {
    pi = (permInfo *)anon_var_dwarf_952da;
  }
  else if (NpnType == 3) {
    pi = (permInfo *)anon_var_dwarf_952e4;
  }
  else if (NpnType == 4) {
    pi = (permInfo *)anon_var_dwarf_952ee;
  }
  else if (NpnType == 5) {
    pi = (permInfo *)anon_var_dwarf_952f8;
  }
  else if (NpnType == 6) {
    pi = (permInfo *)anon_var_dwarf_95302;
  }
  else if (NpnType == 7) {
    pi = (permInfo *)anon_var_dwarf_9530c;
  }
  if (p->nVars < 0x11) {
    if (pi != (permInfo *)0x0) {
      pcVar4 = "s";
      if (p->nFuncs == 1) {
        pcVar4 = "";
      }
      printf("Applying %-20s to %8d func%s of %2d vars...  ",pi,(ulong)(uint)p->nFuncs,pcVar4,
             (ulong)(uint)p->nVars);
    }
    if (fVerbose != 0) {
      printf("\n");
    }
    if (NpnType == 0) {
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
          printf("\n");
        }
      }
    }
    else if (NpnType == 1) {
      Abc_TruthNpnCountUnique(p);
      x = setPermInfoPtr(p->nVars);
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
        }
        simpleMinimal(p->pFuncs[(int)pAlgoName._4_4_],pAuxWord1 + 0x3ff,(word *)(pCanonPerm + 8),x,
                      p->nVars);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
          Abc_TruthNpnPrint(local_6028,0,p->nVars);
          printf("\n");
        }
      }
      freePermInfoPtr(x);
    }
    else if (NpnType == 2) {
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
        }
        resetPCanonPermArray(local_6028,p->nVars);
        uVar1 = Kit_TruthSemiCanonicize
                          ((uint *)p->pFuncs[(int)pAlgoName._4_4_],(uint *)(pAuxWord + 0x3ff),
                           p->nVars,local_6028);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
          Abc_TruthNpnPrint(local_6028,uVar1,p->nVars);
          printf("\n");
        }
      }
    }
    else if (NpnType == 3) {
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
        }
        resetPCanonPermArray(local_6028,p->nVars);
        uVar1 = luckyCanonicizer_final_fast(p->pFuncs[(int)pAlgoName._4_4_],p->nVars,local_6028);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
          Abc_TruthNpnPrint(local_6028,uVar1,p->nVars);
          printf("\n");
        }
      }
    }
    else if (NpnType == 4) {
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
        }
        resetPCanonPermArray(local_6028,p->nVars);
        uVar1 = luckyCanonicizer_final_fast1(p->pFuncs[(int)pAlgoName._4_4_],p->nVars,local_6028);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
          Abc_TruthNpnPrint(local_6028,uVar1,p->nVars);
          printf("\n");
        }
      }
    }
    else if (NpnType == 5) {
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
        }
        uVar1 = Abc_TtCanonicize(p->pFuncs[(int)pAlgoName._4_4_],p->nVars,local_6028);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
          Abc_TruthNpnPrint(local_6028,uVar1,p->nVars);
          printf("\n");
        }
      }
    }
    else if (NpnType == 6) {
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
        }
        uVar1 = Abc_TtCanonicizePhase(p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[(int)pAlgoName._4_4_],p->nVars);
          Abc_TruthNpnPrint((char *)0x0,uVar1,p->nVars);
          printf("\n");
        }
      }
    }
    else {
      if (NpnType != 7) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpn.c"
                      ,0x13a,"void Abc_TruthNpnPerform(Abc_TtStore_t *, int, int)");
      }
      p_00 = Abc_TtManStart(p->nVars);
      for (pAlgoName._4_4_ = 0; (int)pAlgoName._4_4_ < p->nFuncs;
          pAlgoName._4_4_ = pAlgoName._4_4_ + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",(ulong)pAlgoName._4_4_);
        }
        Abc_TtCanonicizeHie(p_00,p->pFuncs[(int)pAlgoName._4_4_],p->nVars,local_6028);
        if (fVerbose != 0) {
          printf("\n");
        }
      }
      pAlgoName._0_4_ = Abc_TtManNumClasses(p_00);
      Abc_TtManStop(p_00);
    }
    aVar3 = Abc_Clock();
    if ((uint)pAlgoName == 0xffffffff) {
      local_605c = Abc_TruthNpnCountUnique(p);
    }
    else {
      local_605c = (uint)pAlgoName;
    }
    printf("Classes =%9d  ",(ulong)local_605c);
    Abc_PrintTime(1,"Time",aVar3 - aVar2);
    return;
  }
  __assert_fail("p->nVars <= 16",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpn.c"
                ,0xcc,"void Abc_TruthNpnPerform(Abc_TtStore_t *, int, int)");
}

Assistant:

void Abc_TruthNpnPerform( Abc_TtStore_t * p, int NpnType, int fVerbose )
{
    unsigned pAux[2048];
    word pAuxWord[1024], pAuxWord1[1024];
    char pCanonPerm[16];
    unsigned uCanonPhase=0;
    abctime clk = Abc_Clock();
    int i, nClasses = -1;

    char * pAlgoName = NULL;
    if ( NpnType == 0 )
        pAlgoName = "uniqifying         ";
    else if ( NpnType == 1 )
        pAlgoName = "exact NPN          ";
    else if ( NpnType == 2 )
        pAlgoName = "counting 1s        ";
    else if ( NpnType == 3 )
        pAlgoName = "Jake's hybrid fast ";
    else if ( NpnType == 4 )
        pAlgoName = "Jake's hybrid good ";
    else if ( NpnType == 5 )
        pAlgoName = "new hybrid fast    ";
    else if ( NpnType == 6 )
        pAlgoName = "new phase flipping ";
    else if ( NpnType == 7 )
        pAlgoName = "new hier. matching ";

    assert( p->nVars <= 16 );
    if ( pAlgoName )
        printf( "Applying %-20s to %8d func%s of %2d vars...  ",  
            pAlgoName, p->nFuncs, (p->nFuncs == 1 ? "":"s"), p->nVars );
    if ( fVerbose )
        printf( "\n" );

    if ( NpnType == 0 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), printf( "\n" );
        }
    }
    else if ( NpnType == 1 )
    {
        permInfo* pi; 
        Abc_TruthNpnCountUnique(p);
        pi = setPermInfoPtr(p->nVars);
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            simpleMinimal(p->pFuncs[i], pAuxWord, pAuxWord1, pi, p->nVars);
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
        freePermInfoPtr(pi);
    }
    else if ( NpnType == 2 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = Kit_TruthSemiCanonicize( (unsigned *)p->pFuncs[i], pAux, p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 3 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = luckyCanonicizer_final_fast( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 4 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = luckyCanonicizer_final_fast1( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 5 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicize( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 6 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizePhase( p->pFuncs[i], p->nVars );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(NULL, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 7 )
    {
        extern unsigned Abc_TtCanonicizeHie( Abc_TtMan_t * p, word * pTruth, int nVars, char * pCanonPerm );
        extern Abc_TtMan_t * Abc_TtManStart( int nVars );
        extern void Abc_TtManStop( Abc_TtMan_t * p );
        extern int Abc_TtManNumClasses( Abc_TtMan_t * p );

        Abc_TtMan_t * pMan = Abc_TtManStart( p->nVars );
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizeHie( pMan, p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
//                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(NULL, uCanonPhase, p->nVars), printf( "\n" );
                printf( "\n" );
        }
        nClasses = Abc_TtManNumClasses( pMan );
        Abc_TtManStop( pMan );
    }
    else assert( 0 );
    clk = Abc_Clock() - clk;
    printf( "Classes =%9d  ", nClasses == -1 ? Abc_TruthNpnCountUnique(p) : nClasses );
    Abc_PrintTime( 1, "Time", clk );
}